

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

Enum xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  void *pvVar7;
  void *pvVar8;
  uint32_t *puVar9;
  Enum EVar10;
  undefined4 uVar11;
  uint32_t uVar12;
  bool bVar13;
  bool bVar14;
  uint32_t uVar15;
  int iVar16;
  uint uVar17;
  Vector2 *pVVar18;
  UvMesh **ppUVar19;
  UvMesh *pUVar20;
  uint *puVar21;
  UvMeshChart *this;
  char *pcVar22;
  char *pcVar23;
  UvMeshInstance *pUVar24;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar25;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar26;
  undefined8 extraout_RDX_02;
  uint32_t i_1;
  Enum EVar27;
  uint32_t uVar28;
  undefined *puVar29;
  Array<unsigned_int> *this_00;
  uint32_t i;
  uint uVar30;
  uint32_t face2;
  UvMeshChart *chart;
  uint local_11c;
  UvMeshInstance *local_118;
  uint local_10c;
  Atlas *local_108;
  UvMesh *local_100;
  ArrayBase *local_f8;
  Array<xatlas::internal::Vector2> *local_f0;
  UvMeshInstance *local_e8;
  uint32_t local_e0;
  uint32_t local_dc;
  Vector2 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  Array<unsigned_int> *local_c0;
  UvMesh *local_b8;
  ArrayBase *local_b0;
  ulong local_a8;
  UvMeshInstance *meshInstance;
  BitArray faceAssigned;
  HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
  vertexToFaceMap;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x22bb,"AddMeshError::Enum xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[1].width == 0) {
    uVar30 = decl->vertexCount;
    pcVar22 = (char *)(ulong)uVar30;
    uVar2 = decl->indexCount;
    uVar4 = uVar2;
    if (uVar2 == 0) {
      uVar4 = uVar30;
    }
    EVar27 = InvalidIndexCount;
    puVar29 = internal::s_print;
    local_108 = atlas;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == 1)) {
      pcVar22 = (char *)((ulong)uVar4 / 3);
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",
                 *(undefined4 *)&atlas[4].field_0x14,uVar30);
    }
    local_10c = uVar4 / 3;
    uVar25 = (ulong)uVar4 % 3;
    if ((int)uVar25 == 0) {
      iVar16 = 0;
      if (uVar2 == 0) {
LAB_00195239:
        local_118 = (UvMeshInstance *)
                    internal::Realloc((void *)0x0,0x28,iVar16,pcVar22,(int)puVar29);
        *(Mesh **)&(local_118->texcoords).m_base.elementSize = (Mesh *)0x0;
        *(float **)&(local_118->texcoords).m_base.capacity = (float *)0x0;
        local_118->mesh = (UvMesh *)0x0;
        (local_118->texcoords).m_base.buffer = (uint8_t *)0x0;
        *(undefined8 *)&local_118->rotateCharts = 0;
        (local_118->texcoords).m_base.elementSize = 8;
        (local_118->texcoords).m_base.capacity = 0;
        local_f0 = &local_118->texcoords;
        meshInstance = local_118;
        internal::Array<xatlas::internal::Vector2>::resize(local_f0,decl->vertexCount);
        uVar26 = extraout_RDX_00;
        for (uVar30 = 0; uVar30 < decl->vertexCount; uVar30 = uVar30 + 1) {
          pfVar1 = (float *)((long)decl->vertexUvData + (ulong)(decl->vertexStride * uVar30));
          fVar5 = *pfVar1;
          fVar6 = pfVar1[1];
          uVar17 = -(uint)(NAN(fVar6) || NAN(fVar5));
          local_d8.y = (float)(~uVar17 & (uint)fVar6);
          local_d8.x = (float)(~uVar17 & (uint)fVar5);
          uStack_d0 = 0;
          uStack_cc = 0;
          pVVar18 = internal::Array<xatlas::internal::Vector2>::operator[](local_f0,uVar30);
          *pVVar18 = local_d8;
          uVar26 = extraout_RDX_01;
        }
        local_118->rotateCharts = decl->rotateCharts;
        pUVar24 = (UvMeshInstance *)&local_108[4].atlasCount;
        local_f8 = (ArrayBase *)pUVar24;
        for (uVar30 = 0; iVar16 = (int)uVar26, uVar30 < *(uint *)&local_108[4].field_0x14;
            uVar30 = uVar30 + 1) {
          ppUVar19 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                               ((Array<xatlas::internal::UvMesh_*> *)local_f8,uVar30);
          iVar16 = bcmp(*ppUVar19,decl,0x38);
          if (iVar16 == 0) {
            ppUVar19 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                                 ((Array<xatlas::internal::UvMesh_*> *)local_f8,uVar30);
            local_b8 = *ppUVar19;
            local_118->mesh = local_b8;
            pUVar24 = local_118;
            iVar16 = extraout_EDX;
            if (local_b8 != (UvMesh *)0x0) {
              if (internal::s_print == (undefined *)0x0) goto LAB_001957b4;
              if (internal::s_printVerbose != 1) goto LAB_0019579a;
              (*(code *)internal::s_print)("   instance of a previous UV mesh\n");
              goto LAB_00195788;
            }
            break;
          }
          uVar26 = extraout_RDX_02;
        }
        pUVar20 = (UvMesh *)internal::Realloc((void *)0x0,0x80,iVar16,(char *)pUVar24,(int)puVar29);
        (pUVar20->decl).vertexCount = 0;
        (pUVar20->decl).vertexStride = 0;
        (pUVar20->decl).vertexUvData = (void *)0x0;
        *(undefined8 *)&(pUVar20->decl).indexCount = 0;
        (pUVar20->decl).indexData = (void *)0x0;
        (pUVar20->decl).indexOffset = 0;
        (pUVar20->decl).indexFormat = UInt16;
        (pUVar20->decl).faceMaterialData = (uint32_t *)0x0;
        *(undefined8 *)&(pUVar20->decl).rotateCharts = 0;
        (pUVar20->indices).m_base.buffer = (uint8_t *)0x0;
        (pUVar20->indices).m_base.elementSize = 0;
        (pUVar20->indices).m_base.size = 0;
        *(undefined8 *)&(pUVar20->indices).m_base.capacity = 0;
        (pUVar20->charts).m_base.buffer = (uint8_t *)0x0;
        (pUVar20->charts).m_base.elementSize = 0;
        (pUVar20->charts).m_base.size = 0;
        *(undefined8 *)&(pUVar20->charts).m_base.capacity = 0;
        (pUVar20->vertexToChartMap).m_base.buffer = (uint8_t *)0x0;
        (pUVar20->vertexToChartMap).m_base.elementSize = 0;
        (pUVar20->vertexToChartMap).m_base.size = 0;
        *(undefined8 *)&(pUVar20->vertexToChartMap).m_base.capacity = 0;
        internal::UvMesh::UvMesh(pUVar20);
        local_118->mesh = pUVar20;
        (pUVar20->decl).rotateCharts = decl->rotateCharts;
        uVar15 = decl->vertexCount;
        uVar12 = decl->vertexStride;
        pvVar7 = decl->vertexUvData;
        uVar28 = decl->indexCount;
        uVar11 = *(undefined4 *)&decl->field_0x14;
        pvVar8 = decl->indexData;
        EVar10 = decl->indexFormat;
        puVar9 = decl->faceMaterialData;
        (pUVar20->decl).indexOffset = decl->indexOffset;
        (pUVar20->decl).indexFormat = EVar10;
        (pUVar20->decl).faceMaterialData = puVar9;
        (pUVar20->decl).indexCount = uVar28;
        *(undefined4 *)&(pUVar20->decl).field_0x14 = uVar11;
        (pUVar20->decl).indexData = pvVar8;
        (pUVar20->decl).vertexCount = uVar15;
        (pUVar20->decl).vertexStride = uVar12;
        (pUVar20->decl).vertexUvData = pvVar7;
        this_00 = &pUVar20->indices;
        local_100 = pUVar20;
        local_d8 = (Vector2)decl;
        local_b8 = pUVar20;
        internal::Array<unsigned_int>::resize(this_00,decl->indexCount);
        for (uVar30 = 0; uVar4 != uVar30; uVar30 = uVar30 + 1) {
          uVar17 = uVar30;
          if (uVar2 != 0) {
            pUVar24 = (UvMeshInstance *)(ulong)uVar30;
            uVar17 = DecodeIndex(*(Enum *)((long)local_d8 + 0x24),*(void **)((long)local_d8 + 0x18),
                                 *(uint32_t *)((long)local_d8 + 0x20),uVar30);
          }
          puVar21 = internal::Array<unsigned_int>::operator[](this_00,uVar30);
          *puVar21 = uVar17;
        }
        local_c0 = &local_100->vertexToChartMap;
        internal::Array<unsigned_int>::resize(local_c0,*(uint32_t *)local_d8);
        for (uVar30 = 0; uVar30 < (local_100->vertexToChartMap).m_base.size; uVar30 = uVar30 + 1) {
          puVar21 = internal::Array<unsigned_int>::operator[](local_c0,uVar30);
          *puVar21 = 0xffffffff;
        }
        vertexToFaceMap.m_memTag = 0;
        vertexToFaceMap.m_numSlots = 0;
        vertexToFaceMap.m_slots = (uint32_t *)0x0;
        vertexToFaceMap.m_keys.m_base.buffer = (uint8_t *)0x0;
        vertexToFaceMap.m_keys.m_base.elementSize = 8;
        vertexToFaceMap.m_keys.m_base.size = 0;
        vertexToFaceMap.m_keys.m_base.capacity = 0;
        vertexToFaceMap.m_next.m_base.buffer = (uint8_t *)0x0;
        vertexToFaceMap.m_next.m_base.elementSize = 4;
        vertexToFaceMap.m_next.m_base.size = 0;
        vertexToFaceMap.m_next.m_base.capacity = 0;
        vertexToFaceMap.m_size = uVar4;
        for (uVar28 = 0; uVar30 = local_10c, uVar4 != uVar28; uVar28 = uVar28 + 1) {
          puVar21 = internal::Array<unsigned_int>::operator[](this_00,uVar28);
          pVVar18 = internal::Array<xatlas::internal::Vector2>::operator[](local_f0,*puVar21);
          internal::
          HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
          ::add(&vertexToFaceMap,pVVar18);
        }
        internal::BitArray::BitArray(&faceAssigned,local_10c);
        memset(faceAssigned.m_wordArray.m_base.buffer,0,
               (ulong)(faceAssigned.m_wordArray.m_base.size *
                      faceAssigned.m_wordArray.m_base.elementSize));
        local_b0 = &(local_100->charts).m_base;
        for (local_11c = 0; local_11c < uVar30; local_11c = local_11c + 1) {
          bVar13 = internal::BitArray::get(&faceAssigned,local_11c);
          if (!bVar13) {
            this = (UvMeshChart *)
                   internal::Realloc((void *)0x0,0x38,extraout_EDX_00,(char *)pUVar24,(int)puVar29);
            (this->indices).m_base.elementSize = 0;
            (this->indices).m_base.size = 0;
            *(undefined8 *)&(this->indices).m_base.capacity = 0;
            *(undefined8 *)&(this->faces).m_base.capacity = 0;
            (this->indices).m_base.buffer = (uint8_t *)0x0;
            (this->faces).m_base.buffer = (uint8_t *)0x0;
            (this->faces).m_base.elementSize = 0;
            (this->faces).m_base.size = 0;
            *(undefined8 *)&this->material = 0;
            internal::UvMeshChart::UvMeshChart(this);
            if (*(long *)((long)local_d8 + 0x28) == 0) {
              uVar28 = 0;
            }
            else {
              uVar28 = *(uint32_t *)(*(long *)((long)local_d8 + 0x28) + (ulong)local_11c * 4);
            }
            this->material = uVar28;
            chart = this;
            internal::BitArray::set(&faceAssigned,local_11c);
            internal::ArrayBase::push_back((ArrayBase *)chart,(uint8_t *)&local_11c);
            do {
              local_e0 = (chart->faces).m_base.size;
              bVar13 = false;
              uVar28 = 0;
              while (uVar28 != local_e0) {
                local_dc = uVar28;
                puVar21 = internal::Array<unsigned_int>::operator[](&chart->faces,uVar28);
                uVar30 = *puVar21;
                local_a8 = (ulong)(uVar30 * 3);
                pUVar24 = (UvMeshInstance *)0x0;
                while ((int)pUVar24 != 3) {
                  local_e8 = pUVar24;
                  puVar21 = internal::Array<unsigned_int>::operator[]
                                      (&local_118->mesh->indices,(int)pUVar24 + (int)local_a8);
                  pVVar18 = internal::Array<xatlas::internal::Vector2>::operator[]
                                      (local_f0,*puVar21);
                  for (uVar28 = internal::
                                HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                                ::get(&vertexToFaceMap,pVVar18); uVar28 != 0xffffffff;
                      uVar28 = internal::
                               HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
                               ::getNext(&vertexToFaceMap,uVar28)) {
                    face2 = uVar28 / 3;
                    bVar14 = internal::BitArray::get(&faceAssigned,face2);
                    if (!bVar14) {
                      lVar3 = *(long *)((long)local_d8 + 0x28);
                      if ((lVar3 == 0) ||
                         (*(int *)(lVar3 + (ulong)uVar30 * 4) == *(int *)(lVar3 + (ulong)face2 * 4))
                         ) {
                        internal::BitArray::set(&faceAssigned,face2);
                        bVar13 = true;
                        internal::ArrayBase::push_back((ArrayBase *)chart,(uint8_t *)&face2);
                      }
                    }
                  }
                  pUVar24 = (UvMeshInstance *)(ulong)((int)local_e8 + 1);
                }
                uVar28 = local_dc + 1;
              }
            } while (bVar13);
            for (uVar30 = 0; uVar30 < (chart->faces).m_base.size; uVar30 = uVar30 + 1) {
              local_e8 = (UvMeshInstance *)CONCAT44(local_e8._4_4_,uVar30);
              for (iVar16 = 0; iVar16 != 3; iVar16 = iVar16 + 1) {
                pUVar20 = local_118->mesh;
                puVar21 = internal::Array<unsigned_int>::operator[](&chart->faces,uVar30);
                puVar21 = internal::Array<unsigned_int>::operator[]
                                    (&pUVar20->indices,*puVar21 * 3 + iVar16);
                face2 = *puVar21;
                internal::ArrayBase::push_back(&(chart->indices).m_base,(uint8_t *)&face2);
                uVar28 = (local_100->charts).m_base.size;
                puVar21 = internal::Array<unsigned_int>::operator[](local_c0,face2);
                *puVar21 = uVar28;
                uVar30 = (uint32_t)local_e8;
              }
            }
            internal::ArrayBase::push_back(local_b0,(uint8_t *)&chart);
            uVar30 = local_10c;
          }
        }
        internal::ArrayBase::push_back(local_f8,(uint8_t *)&local_b8);
        internal::ArrayBase::~ArrayBase(&faceAssigned.m_wordArray.m_base);
        internal::
        HashMap<xatlas::internal::Vector2,_xatlas::internal::Hash<xatlas::internal::Vector2>,_xatlas::internal::Equal<xatlas::internal::Vector2>_>
        ::~HashMap(&vertexToFaceMap);
LAB_00195788:
        if (internal::s_print != (undefined *)0x0) {
LAB_0019579a:
          if ((internal::s_printVerbose & 1) != 0) {
            (*(code *)internal::s_print)("   %u charts\n",(local_118->mesh->charts).m_base.size);
          }
        }
LAB_001957b4:
        internal::ArrayBase::push_back
                  ((ArrayBase *)&local_108[4].utilization,(uint8_t *)&meshInstance);
        EVar27 = Success;
      }
      else {
        EVar27 = IndexOutOfRange;
        pcVar23 = (char *)0x0;
        do {
          iVar16 = (int)uVar25;
          uVar28 = (uint32_t)pcVar23;
          if (uVar4 == uVar28) goto LAB_00195239;
          uVar15 = DecodeIndex(decl->indexFormat,decl->indexData,decl->indexOffset,uVar28);
          pcVar22 = pcVar23;
          uVar25 = extraout_RDX;
          pcVar23 = (char *)(ulong)(uVar28 + 1);
        } while (uVar15 < decl->vertexCount);
      }
    }
  }
  else {
    EVar27 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return EVar27;
}

Assistant:

AddMeshError::Enum AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (ctx->meshCount > 0) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
	const bool decoded = (decl.indexCount <= 0);
	const uint32_t indexCount = decoded ? decl.vertexCount : decl.indexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (!decoded) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->texcoords.resize(decl.vertexCount);
	for (uint32_t i = 0; i < decl.vertexCount; i++) {
		internal::Vector2 texcoord = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Set nan values to 0.
		if (internal::isNan(texcoord.x) || internal::isNan(texcoord.y))
			texcoord.x = texcoord.y = 0.0f;
		meshInstance->texcoords[i] = texcoord;
	}
	meshInstance->rotateCharts = decl.rotateCharts;
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			meshInstance->mesh = mesh = ctx->uvMeshes[m];
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		meshInstance->mesh = mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		mesh->decl = decl;
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = decoded ? i : DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
		mesh->vertexToChartMap.resize(decl.vertexCount);
		for (uint32_t i = 0; i < mesh->vertexToChartMap.size(); i++)
			mesh->vertexToChartMap[i] = UINT32_MAX;
		// Calculate charts (incident faces).
		internal::HashMap<internal::Vector2> vertexToFaceMap(internal::MemTag::Default, indexCount); // Face is index / 3
		const uint32_t faceCount = indexCount / 3;
		for (uint32_t i = 0; i < indexCount; i++)
			vertexToFaceMap.add(meshInstance->texcoords[mesh->indices[i]]);
		internal::BitArray faceAssigned(faceCount);
		faceAssigned.zeroOutMemory();
		for (uint32_t f = 0; f < faceCount; f++) {
			if (faceAssigned.get(f))
				continue;
			// Found an unassigned face, create a new chart.
			internal::UvMeshChart *chart = XA_NEW(internal::MemTag::Default, internal::UvMeshChart);
			chart->material = decl.faceMaterialData ? decl.faceMaterialData[f] : 0;
			// Walk incident faces and assign them to the chart.
			faceAssigned.set(f);
			chart->faces.push_back(f);
			for (;;) {
				bool newFaceAssigned = false;
				const uint32_t faceCount2 = chart->faces.size();
				for (uint32_t f2 = 0; f2 < faceCount2; f2++) {
					const uint32_t face = chart->faces[f2];
					for (uint32_t i = 0; i < 3; i++) {
						const internal::Vector2 &texcoord = meshInstance->texcoords[meshInstance->mesh->indices[face * 3 + i]];
						uint32_t mapIndex = vertexToFaceMap.get(texcoord);
						while (mapIndex != UINT32_MAX) {
							const uint32_t face2 = mapIndex / 3; // 3 vertices added per face.
							// Materials must match.
							if (!faceAssigned.get(face2) && (!decl.faceMaterialData || decl.faceMaterialData[face] == decl.faceMaterialData[face2])) {
								faceAssigned.set(face2);
								chart->faces.push_back(face2);
								newFaceAssigned = true;
							}
							mapIndex = vertexToFaceMap.getNext(mapIndex);
						}
					}
				}
				if (!newFaceAssigned)
					break;
			}
			for (uint32_t i = 0; i < chart->faces.size(); i++) {
				for (uint32_t j = 0; j < 3; j++) {
					const uint32_t vertex = meshInstance->mesh->indices[chart->faces[i] * 3 + j];
					chart->indices.push_back(vertex);
					mesh->vertexToChartMap[vertex] = mesh->charts.size();
				}
			}
			mesh->charts.push_back(chart);
		}
		ctx->uvMeshes.push_back(mesh);
	} else {
		XA_PRINT("   instance of a previous UV mesh\n");
	}
	XA_PRINT("   %u charts\n", meshInstance->mesh->charts.size());
	ctx->uvMeshInstances.push_back(meshInstance);
	return AddMeshError::Success;
}